

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O2

void __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::rehash
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,size_t n)

{
  pointer ppVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *__range2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2_1;
  pair<int,_int> *val_1;
  pointer val;
  float fVar4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> tmp;
  ulong local_60;
  iterator __begin0;
  iterator __end0;
  
  fVar4 = load_factor(this);
  uVar2 = ((long)(this->mBuckets).
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mBuckets).
                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if ((this->mMaxLoadFactor <= fVar4) || (uVar2 < n)) {
    local_60 = uVar2 * 2;
    if (local_60 < n) {
      local_60 = n;
    }
    puVar3 = std::__lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                       (PRIMES,&__GNU_EH_FRAME_HDR,&local_60);
    local_60 = *puVar3;
    tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    begin(&__begin0,this);
    end(&__end0,this);
    while (__begin0.mCurValueItr._M_current != __end0.mCurValueItr._M_current) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (&tmp,__begin0.mCurValueItr._M_current);
      hashtable_iterator::operator++(&__begin0);
    }
    clear(this);
    std::
    vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ::resize(&this->mBuckets,local_60);
    ppVar1 = tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (val = tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start; val != ppVar1; val = val + 1) {
      insert((pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool>
              *)&__begin0,this,val);
    }
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  }
  return;
}

Assistant:

void rehash(size_t n) {
      if (load_factor() < max_load_factor() && n <= mBuckets.size()) return;
      n = std::max(n, mBuckets.size()*2);
      n = *std::lower_bound(PRIMES,PRIMES+N_PRIMES,n);

      std::vector<ValueT> tmp;
      for (auto& val : *this) {
        tmp.push_back(val);
      }
      this->clear();
      mBuckets.resize(n);
      for (auto& val : tmp) {
        this->insert(val);
      }
    }